

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v9::detail::
       parse_align<char,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v9::detail::specs_handler<char>_> *handler)

{
  char cVar1;
  basic_format_specs<char> *pbVar2;
  align_t align;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  pcVar3 = begin + (char)("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                          [(byte)*begin >> 3] +
                         ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                          [(byte)*begin >> 3] == '\0'));
  if (end == pcVar3 || (long)end - (long)pcVar3 < 0) {
    pcVar3 = begin;
  }
  align = none;
  while( true ) {
    cVar1 = *pcVar3;
    if (cVar1 == '^') {
      align = center;
    }
    else if (cVar1 == '>') {
      align = right;
    }
    else if (cVar1 == '<') {
      align = left;
    }
    if (align != none) break;
    bVar6 = pcVar3 == begin;
    pcVar3 = begin;
    if (bVar6) {
      return begin;
    }
  }
  uVar4 = (long)pcVar3 - (long)begin;
  if (uVar4 != 0) {
    if (*begin == 0x7b) {
      throw_format_error("invalid fill character \'{\'");
    }
    if (4 < uVar4) {
      throw_format_error("invalid fill");
    }
    pbVar2 = (handler->super_specs_handler<char>).super_specs_setter<char>.specs_;
    if (pcVar3 != begin) {
      uVar5 = 0;
      do {
        (pbVar2->fill).data_[uVar5] = begin[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    (pbVar2->fill).size_ = (uchar)uVar4;
    begin = pcVar3;
  }
  specs_checker<fmt::v9::detail::specs_handler<char>_>::on_align(handler,align);
  return begin + 1;
}

Assistant:

FMT_CONSTEXPR auto code_point_length(const Char* begin) -> int {
  if (const_check(sizeof(Char) != 1)) return 1;
  int len = code_point_length_impl(static_cast<char>(*begin));

  // Compute the pointer to the next character early so that the next
  // iteration can start working on the next character. Neither Clang
  // nor GCC figure out this reordering on their own.
  return len + !len;
}